

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags_unittest.cc
# Opt level: O2

void gflags::anon_unknown_5::TestFlagString
               (string *flags,string *expected_string,bool expected_bool,int32 expected_int32,
               double expected_double)

{
  bool bVar1;
  __type _Var2;
  char *pcVar3;
  char *pcVar4;
  
  pcVar3 = GetArgv0();
  bVar1 = ReadFlagsFromString(flags,pcVar3,true);
  if (bVar1) {
    _Var2 = std::operator==(expected_string,fLS::FLAGS_test_string_abi_cxx11_);
    if (_Var2) {
      if ((bool)fLB::FLAGS_test_bool == expected_bool) {
        if (fLI::FLAGS_test_int32 == expected_int32) {
          if ((fLD::FLAGS_test_double + -0.001 <= expected_double) &&
             (expected_double <= fLD::FLAGS_test_double + 0.001)) {
            return;
          }
          fprintf(_stderr,"Check failed: %s == %s\n","expected_double","FLAGS_test_double");
          goto LAB_001339a7;
        }
        pcVar3 = "expected_int32";
        pcVar4 = "FLAGS_test_int32";
      }
      else {
        pcVar3 = "expected_bool";
        pcVar4 = "FLAGS_test_bool";
      }
    }
    else {
      pcVar3 = "expected_string";
      pcVar4 = "FLAGS_test_string";
    }
    fprintf(_stderr,"Check failed: %s %s %s\n",pcVar3,"==",pcVar4);
  }
  else {
    fprintf(_stderr,"Check failed: %s\n","ReadFlagsFromString(flags, GetArgv0(), true)");
  }
LAB_001339a7:
  exit(1);
}

Assistant:

void TestFlagString(const string& flags,
                    const string& expected_string,
                    bool expected_bool,
                    int32 expected_int32,
                    double expected_double) {
  EXPECT_TRUE(ReadFlagsFromString(flags,
                                  GetArgv0(),
                                  // errors are fatal
                                  true));

  EXPECT_EQ(expected_string, FLAGS_test_string);
  EXPECT_EQ(expected_bool, FLAGS_test_bool);
  EXPECT_EQ(expected_int32, FLAGS_test_int32);
  EXPECT_DOUBLE_EQ(expected_double, FLAGS_test_double);
}